

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

FrameBuffer * __thiscall Imf_3_4::InputFile::frameBuffer(InputFile *this)

{
  bool bVar1;
  pointer this_00;
  element_type *peVar2;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  FrameBuffer *local_8;
  
  std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f5f1c);
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f5f37);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                      *)0x1f5f43);
  if (bVar1) {
    std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f5f57);
    this_00 = std::
              unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
              ::operator->((unique_ptr<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
                            *)0x1f5f63);
    local_8 = CompositeDeepScanLine::frameBuffer(this_00);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1f5fac);
    local_8 = &peVar2->_cacheFrameBuffer;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f5fc9);
  return local_8;
}

Assistant:

const FrameBuffer&
InputFile::frameBuffer () const
{
    // Really not actual protection once this returns...
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif

    if (_data->_compositor) { return _data->_compositor->frameBuffer (); }

    return _data->_cacheFrameBuffer;
}